

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitiveIntegers.c
# Opt level: O0

void sysbvm_primitiveInteger_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_context_t *context_local;
  
  sysbvm_char8_setupPrimitives(context);
  sysbvm_uint8_setupPrimitives(context);
  sysbvm_int8_setupPrimitives(context);
  sysbvm_char16_setupPrimitives(context);
  sysbvm_uint16_setupPrimitives(context);
  sysbvm_int16_setupPrimitives(context);
  sysbvm_char32_setupPrimitives(context);
  sysbvm_uint32_setupPrimitives(context);
  sysbvm_int32_setupPrimitives(context);
  sysbvm_uint64_setupPrimitives(context);
  sysbvm_int64_setupPrimitives(context);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).integerType,"bflgs",1,0x1c,(void *)0x0,
             sysbvm_uint64_primitive_fromInteger);
  if ((context->roots).sizeType == (context->roots).uint32Type) {
    sysbvm_context_setIntrinsicPrimitiveMethod
              (context,(context->roots).integerType,"uptr",1,0x1c,(void *)0x0,
               sysbvm_uint32_primitive_fromInteger);
    sysbvm_context_setIntrinsicPrimitiveMethod
              (context,(context->roots).integerType,"iptr",1,0x1c,(void *)0x0,
               sysbvm_int32_primitive_fromInteger);
    sysbvm_context_setIntrinsicPrimitiveMethod
              (context,(context->roots).integerType,"sz",1,0x1c,(void *)0x0,
               sysbvm_uint32_primitive_fromInteger);
    sVar1 = sysbvm_symbol_internWithCString(context,"Size::+");
    sVar3 = (context->roots).uint32Type;
    sVar2 = sysbvm_symbol_internWithCString(context,"+");
    sVar3 = sysbvm_type_lookupSelector(context,sVar3,sVar2);
    sysbvm_context_setIntrinsicSymbolBindingValue(context,sVar1,sVar3);
  }
  else {
    sysbvm_context_setIntrinsicPrimitiveMethod
              (context,(context->roots).integerType,"uptr",1,0x1c,(void *)0x0,
               sysbvm_uint64_primitive_fromInteger);
    sysbvm_context_setIntrinsicPrimitiveMethod
              (context,(context->roots).integerType,"iptr",1,0x1c,(void *)0x0,
               sysbvm_int64_primitive_fromInteger);
    sysbvm_context_setIntrinsicPrimitiveMethod
              (context,(context->roots).integerType,"sz",1,0x1c,(void *)0x0,
               sysbvm_uint64_primitive_fromInteger);
    sVar1 = sysbvm_symbol_internWithCString(context,"Size::+");
    sVar3 = (context->roots).uint64Type;
    sVar2 = sysbvm_symbol_internWithCString(context,"+");
    sVar3 = sysbvm_type_lookupSelector(context,sVar3,sVar2);
    sysbvm_context_setIntrinsicSymbolBindingValue(context,sVar1,sVar3);
  }
  return;
}

Assistant:

void sysbvm_primitiveInteger_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_char8_setupPrimitives(context);
    sysbvm_uint8_setupPrimitives(context);
    sysbvm_int8_setupPrimitives(context);

    sysbvm_char16_setupPrimitives(context);
    sysbvm_uint16_setupPrimitives(context);
    sysbvm_int16_setupPrimitives(context);

    sysbvm_char32_setupPrimitives(context);
    sysbvm_uint32_setupPrimitives(context);
    sysbvm_int32_setupPrimitives(context);

    sysbvm_uint64_setupPrimitives(context);
    sysbvm_int64_setupPrimitives(context);

    if(sizeof(sysbvm_bitflags_t) == 4)
    {
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "bflgs", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_uint32_primitive_fromInteger);
    }
    else
    {
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "bflgs", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_uint64_primitive_fromInteger);
    }

    if(context->roots.sizeType == context->roots.uint32Type)
    {
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "uptr", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_uint32_primitive_fromInteger);
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "iptr", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_int32_primitive_fromInteger);
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "sz", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_uint32_primitive_fromInteger);
        sysbvm_context_setIntrinsicSymbolBindingValue(context, sysbvm_symbol_internWithCString(context, "Size::+"), sysbvm_type_lookupSelector(context, context->roots.uint32Type, sysbvm_symbol_internWithCString(context, "+")));
    }
    else
    {
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "uptr", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_uint64_primitive_fromInteger);
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "iptr", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_int64_primitive_fromInteger);
        sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.integerType, "sz", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_uint64_primitive_fromInteger);
        sysbvm_context_setIntrinsicSymbolBindingValue(context, sysbvm_symbol_internWithCString(context, "Size::+"), sysbvm_type_lookupSelector(context, context->roots.uint64Type, sysbvm_symbol_internWithCString(context, "+")));
    }
}